

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::rollDice(Dice *this,bool testing)

{
  int iVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  long lVar4;
  undefined7 in_register_00000031;
  int numbOfDice;
  double local_38;
  
  if ((int)CONCAT71(in_register_00000031,testing) != 0) {
    std::operator<<((ostream *)&std::cout,"How many dice do you want to roll? \n");
    std::istream::operator>>((istream *)&std::cin,&numbOfDice);
    for (iVar3 = 0; iVar3 < numbOfDice; iVar3 = iVar3 + 1) {
      iVar1 = rand();
      this->totalDiceValues[(long)iVar1 % 6 & 0xffffffff] =
           this->totalDiceValues[(long)iVar1 % 6 & 0xffffffff] + 1;
    }
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      local_38 = ((double)this->totalDiceValues[lVar4] / (double)numbOfDice) * 100.0;
      poVar2 = std::operator<<((ostream *)&std::cout,this->DiceNames[lVar4]);
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->totalDiceValues[lVar4]);
      std::operator<<(poVar2,": Probability = ");
      poVar2 = std::ostream::_M_insert<double>(local_38);
      poVar2 = std::operator<<(poVar2,"%");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  return;
}

Assistant:

void Dice::rollDice(bool testing) {

    if(!testing)
    {return;}

    int numbOfDice;
    cout << "How many dice do you want to roll? \n";
    cin >> numbOfDice;
    DiceOptions value;

    for(int i=0; i<numbOfDice; i++)
    {
        value = randomDiceOption();
        this->totalDiceValues[value]++ ;
    }
    double probability=0.00;
    for(int i=0; i<6; i++) {
        probability = double(this->totalDiceValues[i]) / double(numbOfDice) *100.00 ;
        cout << DiceNames[i] << " : " << this->totalDiceValues[i] << ": Probability = " << probability << "%" <<  endl;
    }
}